

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_catalog_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::ViewCatalogEntry::AlterEntry(ViewCatalogEntry *this,ClientContext *context,AlterInfo *info)

{
  size_t __n;
  int iVar1;
  reference pvVar2;
  BinderException *this_00;
  pointer pCVar3;
  reference this_01;
  CatalogException *this_02;
  InternalException *this_03;
  long in_RCX;
  size_type __n_00;
  allocator_type local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  __node_base_ptr p_Stack_40;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_38;
  
  if (*(char *)(in_RCX + 9) == '\x02') {
    if (*(char *)(in_RCX + 0x71) == '\x01') {
      (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                     internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->config).home_directory._M_dataplus)(this,context);
      pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
               operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                           *)this);
      ::std::__cxx11::string::_M_assign((string *)&pCVar3->name);
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
    }
    this_03 = (InternalException *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Unrecognized alter view type!","");
    InternalException::InternalException(this_03,(string *)&local_a8);
    __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(char *)(in_RCX + 9) == '\b') {
    (**(code **)&(((context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                   internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->config).home_directory._M_dataplus)(this,context);
    if ((_Hash_node_base *)(context->config).set_variables._M_h._M_element_count !=
        (context->config).set_variables._M_h._M_before_begin._M_nxt) {
      __n_00 = 0;
      do {
        pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)&(context->config).set_variables._M_h._M_before_begin,__n_00);
        __n = pvVar2->_M_string_length;
        if ((__n == *(size_t *)(in_RCX + 0x80)) &&
           ((__n == 0 ||
            (iVar1 = bcmp((pvVar2->_M_dataplus)._M_p,*(void **)(in_RCX + 0x78),__n), iVar1 == 0))))
        {
          pCVar3 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                   ::operator->((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                                 *)this);
          if ((__node_base_ptr)pCVar3[1].tags._M_h._M_rehash_policy._M_next_resize ==
              pCVar3[1].tags._M_h._M_single_bucket) {
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48,
                       ((long)pCVar3[1].tags._M_h._M_buckets -
                        (long)pCVar3[1].comment.value_info_.internal.
                              super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi >> 3) * -0x5555555555555555,&local_a9);
            local_a8.field_2._M_allocated_capacity =
                 (size_type)
                 pCVar3[1].child.
                 super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
                 .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
            pCVar3[1].child.
            super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
            super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>
            .super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
                 local_38._M_head_impl;
            local_a8._M_dataplus._M_p = (pointer)pCVar3[1].tags._M_h._M_rehash_policy._M_next_resize
            ;
            local_a8._M_string_length = (size_type)pCVar3[1].tags._M_h._M_single_bucket;
            pCVar3[1].tags._M_h._M_rehash_policy._M_next_resize = local_48;
            pCVar3[1].tags._M_h._M_single_bucket = p_Stack_40;
            local_48 = 0;
            p_Stack_40 = (__node_base_ptr)0x0;
            local_38._M_head_impl = (CatalogEntry *)0x0;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a8);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
          }
          this_01 = vector<duckdb::Value,_true>::operator[]
                              ((vector<duckdb::Value,_true> *)
                               &pCVar3[1].tags._M_h._M_rehash_policy._M_next_resize,__n_00);
          Value::operator=(this_01,(Value *)(in_RCX + 0x98));
          return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
                 (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)((context->config).set_variables._M_h._M_element_count -
                                      (long)(context->config).set_variables._M_h._M_before_begin.
                                            _M_nxt) >> 5));
    }
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"View \"%s\" does not have a column with name \"%s\"","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*(long *)&context->interrupted,
               (long)&((context->registered_state).
                       super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                       .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                      ->lock + *(long *)&context->interrupted);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,*(long *)(in_RCX + 0x78),
               *(long *)(in_RCX + 0x80) + *(long *)(in_RCX + 0x78));
    BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
              (this_00,&local_a8,&local_68,&local_88);
    __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Can only modify view with ALTER VIEW statement","");
  CatalogException::CatalogException(this_02,&local_a8);
  __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CatalogEntry> ViewCatalogEntry::AlterEntry(ClientContext &context, AlterInfo &info) {
	D_ASSERT(!internal);

	// Column comments have a special alter type
	if (info.type == AlterType::SET_COLUMN_COMMENT) {
		auto &comment_on_column_info = info.Cast<SetColumnCommentInfo>();
		auto copied_view = Copy(context);

		for (idx_t i = 0; i < names.size(); i++) {
			const auto &col_name = names[i];
			if (col_name == comment_on_column_info.column_name) {
				auto &copied_view_entry = copied_view->Cast<ViewCatalogEntry>();

				// If vector is empty, we need to initialize it on setting here
				if (copied_view_entry.column_comments.empty()) {
					copied_view_entry.column_comments = vector<Value>(copied_view_entry.types.size());
				}

				copied_view_entry.column_comments[i] = comment_on_column_info.comment_value;
				return copied_view;
			}
		}
		throw BinderException("View \"%s\" does not have a column with name \"%s\"", name,
		                      comment_on_column_info.column_name);
	}

	if (info.type != AlterType::ALTER_VIEW) {
		throw CatalogException("Can only modify view with ALTER VIEW statement");
	}
	auto &view_info = info.Cast<AlterViewInfo>();
	switch (view_info.alter_view_type) {
	case AlterViewType::RENAME_VIEW: {
		auto &rename_info = view_info.Cast<RenameViewInfo>();
		auto copied_view = Copy(context);
		copied_view->name = rename_info.new_view_name;
		return copied_view;
	}
	default:
		throw InternalException("Unrecognized alter view type!");
	}
}